

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::int_::int_(int_ *this,object *o)

{
  bool bVar1;
  handle *this_00;
  PyObject *pPVar2;
  undefined8 uVar3;
  handle *in_RSI;
  object *in_RDI;
  error_already_set *in_stack_00000010;
  handle in_stack_ffffffffffffffb0;
  PyObject *local_48;
  handle local_18;
  handle *local_10;
  
  local_10 = in_RSI;
  bVar1 = check_(in_stack_ffffffffffffffb0);
  if (bVar1) {
    this_00 = pybind11::handle::inc_ref((handle *)in_stack_ffffffffffffffb0.m_ptr);
    local_48 = pybind11::handle::ptr(this_00);
  }
  else {
    pPVar2 = pybind11::handle::ptr(local_10);
    local_48 = (PyObject *)PyNumber_Long(pPVar2);
  }
  pybind11::handle::handle(&local_18,local_48);
  object::object(in_RDI,local_18.m_ptr);
  if ((in_RDI->super_handle).m_ptr == (PyObject *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    error_already_set::error_already_set(in_stack_00000010);
    __cxa_throw(uVar3,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

int_() : object(PyLong_FromLong(0), stolen_t{}) { }